

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::IntegerFunctionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,IntegerFunctionTestInstance *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *poVar2;
  ShaderExecutor *pSVar3;
  TestContext *pTVar4;
  TestStatus *pTVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  pointer pSVar10;
  ulong uVar11;
  long lVar12;
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  vector<void_*,_std::allocator<void_*>_> local_2c8;
  vector<void_*,_std::allocator<void_*>_> local_2b0;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *local_298;
  ShaderSpec *local_290;
  VarValue local_288;
  undefined1 local_278 [16];
  vector<void_*,_std::allocator<void_*>_> local_268;
  string *local_250;
  vector<void_*,_std::allocator<void_*>_> local_248;
  TestStatus *local_230;
  ostringstream *local_228;
  IntegerFunctionTestInstance *local_220;
  ulong local_218;
  vector<int,_std::allocator<int>_> local_210;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pSVar10 = (this->m_spec).inputs.
            super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = 0;
  iVar9 = 0;
  if (pSVar10 !=
      (this->m_spec).inputs.
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar9 = 0;
    do {
      iVar6 = glu::VarType::getScalarSize(&pSVar10->varType);
      iVar9 = iVar9 + iVar6;
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 !=
             (this->m_spec).inputs.
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar10 = (this->m_spec).outputs.
            super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar10 !=
      (this->m_spec).outputs.
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar8 = 0;
    do {
      iVar6 = glu::VarType::getScalarSize(&pSVar10->varType);
      iVar8 = iVar8 + iVar6;
      pSVar10 = pSVar10 + 1;
    } while (pSVar10 !=
             (this->m_spec).outputs.
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c8,(long)(iVar9 * this->m_numValues),(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e0,(long)(iVar8 * this->m_numValues),(allocator_type *)local_1b0);
  local_290 = &this->m_spec;
  shaderexecutor::anon_unknown_0::getInputOutputPointers
            (&local_268,&local_290->inputs,&local_1c8,this->m_numValues);
  local_298 = &(this->m_spec).outputs;
  shaderexecutor::anon_unknown_0::getInputOutputPointers
            (&local_248,local_298,&local_1e0,this->m_numValues);
  (*(this->super_TestInstance)._vptr_TestInstance[4])
            (this,(ulong)(uint)this->m_numValues,
             local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar3 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar3->_vptr_ShaderExecutor[2])
            (pSVar3,(ulong)(uint)this->m_numValues,
             local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  shaderexecutor::anon_unknown_0::getScalarSizes(&local_1f8,&local_290->inputs);
  shaderexecutor::anon_unknown_0::getScalarSizes(&local_210,local_298);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_2c8,
             (long)local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1b0);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_2b0,
             (long)local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1b0);
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx;
  local_230 = __return_storage_ptr__;
  if (this->m_numValues < 1) {
    uVar11 = 0;
  }
  else {
    local_228 = &this->m_failMsg;
    local_250 = (string *)&this->field_0xa0;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    this_00 = (ostringstream *)(local_1b0 + 8);
    uVar11 = 0;
    iVar8 = 0;
    local_220 = this;
    do {
      if (0 < (int)((ulong)((long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar7 = 0;
        do {
          local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] =
               (void *)((long)(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar7] * iVar8) * 4 +
                       (long)local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)local_2c8.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2c8.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      if (0 < (int)((ulong)((long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar7 = 0;
        do {
          local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] =
               (void *)((long)(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar7] * iVar8) * 4 +
                       (long)local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)local_2b0.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2b0.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      iVar9 = (*(this->super_TestInstance)._vptr_TestInstance[3])
                        (this,local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      poVar2 = (ostringstream *)(local_1b0 + 8);
      if ((char)iVar9 == '\0') {
        local_1b0._0_8_ = pTVar4->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"ERROR: comparison failed for value ",0x23);
        std::ostream::operator<<(poVar2,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,":\n  ",4);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),(char *)local_288.type,(long)local_288.value);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_288.type != (VarType *)local_278) {
          operator_delete(local_288.type,local_278._0_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        local_1b0._0_8_ = pTVar4->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        local_218 = uVar11;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  inputs:",9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
        if (0 < (int)((ulong)((long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar7 = 0x20;
          lVar12 = 0;
          do {
            local_1b0._0_8_ = pTVar4->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"    ",4);
            pSVar10 = (local_290->inputs).
                      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,*(char **)((long)pSVar10 + lVar7 + -0x20),
                       *(long *)((long)pSVar10 + lVar7 + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            local_288.type =
                 (VarType *)
                 ((long)&(((local_290->inputs).
                           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                           ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar7);
            local_288.value =
                 local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_288);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            lVar12 = lVar12 + 1;
            lVar7 = lVar7 + 0x38;
          } while (lVar12 < (int)((ulong)((long)local_2c8.
                                                super__Vector_base<void_*,_std::allocator<void_*>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_2c8.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        local_1b0._0_8_ = pTVar4->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  outputs:",10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
        if (0 < (int)((ulong)((long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar7 = 0x20;
          lVar12 = 0;
          do {
            local_1b0._0_8_ = pTVar4->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"    ",4);
            pSVar10 = (local_298->
                      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,*(char **)((long)pSVar10 + lVar7 + -0x20),
                       *(long *)((long)pSVar10 + lVar7 + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
            local_288.type =
                 (VarType *)
                 ((long)&(((local_298->
                           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar7);
            local_288.value =
                 local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_288);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            lVar12 = lVar12 + 1;
            lVar7 = lVar7 + 0x38;
          } while (lVar12 < (int)((ulong)((long)local_2b0.
                                                super__Vector_base<void_*,_std::allocator<void_*>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_2b0.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
        std::__cxx11::stringbuf::str(local_250);
        uVar11 = local_218;
        this = local_220;
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)local_228 + -0x18) + (int)local_228);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->m_numValues);
  }
  local_1b0._0_8_ = pTVar4->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,this->m_numValues - (int)uVar11);
  pTVar5 = local_230;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,this->m_numValues);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = local_1a0;
  if ((int)uVar11 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
    pTVar5->m_code = QP_TEST_RESULT_PASS;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1b0._0_8_,
               (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Result comparison failed","");
    pTVar5->m_code = QP_TEST_RESULT_FAIL;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1b0._0_8_,
               (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
  }
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  if (local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus IntegerFunctionTestInstance::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;
		tcu::TestContext&		testCtx				= m_context.getTestContext();
		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		if (numFailed == 0)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Result comparison failed");
	}
}